

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_fmadd_tricore(CPUTriCoreState *env,uint32_t r1,uint32_t r2,uint32_t r3)

{
  byte flags_00;
  float32 arg1_00;
  float32 arg2_00;
  float32 arg3_00;
  float32 local_30;
  float32 f_result;
  float32 arg3;
  float32 arg2;
  float32 arg1;
  uint32_t flags;
  uint32_t r3_local;
  uint32_t r2_local;
  uint32_t r1_local;
  CPUTriCoreState *env_local;
  
  local_30 = float32_muladd_tricore(r1,r2,r3,0,&env->fp_status);
  flags_00 = f_get_excp_flags(env);
  if (flags_00 == 0) {
    env->PSW_USB_C = 0;
  }
  else {
    if ((flags_00 & 1) != 0) {
      arg1_00 = float32_squash_input_denormal_tricore(r1,&env->fp_status);
      arg2_00 = float32_squash_input_denormal_tricore(r2,&env->fp_status);
      arg3_00 = float32_squash_input_denormal_tricore(r3,&env->fp_status);
      local_30 = f_maddsub_nan_result(arg1_00,arg2_00,arg3_00,local_30,0);
    }
    f_update_psw_flags(env,flags_00);
  }
  return local_30;
}

Assistant:

uint32_t helper_fmadd(CPUTriCoreState *env, uint32_t r1,
                      uint32_t r2, uint32_t r3)
{
    uint32_t flags;
    float32 arg1 = make_float32(r1);
    float32 arg2 = make_float32(r2);
    float32 arg3 = make_float32(r3);
    float32 f_result;

    f_result = float32_muladd(arg1, arg2, arg3, 0, &env->fp_status);

    flags = f_get_excp_flags(env);
    if (flags) {
        if (flags & float_flag_invalid) {
            arg1 = float32_squash_input_denormal(arg1, &env->fp_status);
            arg2 = float32_squash_input_denormal(arg2, &env->fp_status);
            arg3 = float32_squash_input_denormal(arg3, &env->fp_status);
            f_result = f_maddsub_nan_result(arg1, arg2, arg3, f_result, 0);
        }
        f_update_psw_flags(env, flags);
    } else {
        env->FPU_FS = 0;
    }
    return (uint32_t)f_result;
}